

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void __thiscall
xLearn::MAPEMetric::Accumulate
          (MAPEMetric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  ostream *poVar6;
  long lVar7;
  real_t rVar8;
  Logger local_a0;
  allocator local_9a;
  allocator local_99;
  vector<float,_std::allocator<float>_> *local_98;
  vector<float,_std::allocator<float>_> sum;
  string local_70;
  vector<float,_std::allocator<float>_> *local_50;
  vector<float,_std::allocator<float>_> *local_48;
  
  uVar2 = (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_98 = Y;
  if (uVar2 == (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    this->total_example_ = this->total_example_ + (int)(uVar2 >> 2);
    local_70._M_dataplus._M_p = local_70._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<float,_std::allocator<float>_>::vector
              (&sum,(this->super_Metric).threadNumber_,(value_type_conflict1 *)&local_70,
               (allocator_type *)&local_a0);
    lVar7 = 0;
    uVar2 = 0;
    while (uVar1 = (this->super_Metric).threadNumber_, uVar2 < uVar1) {
      uVar3 = (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      uVar4 = uVar3 / uVar1;
      sVar5 = uVar4 * (uVar2 + 1);
      local_70.field_2._M_allocated_capacity = uVar4 * uVar2;
      local_70._M_dataplus._M_p = (pointer)mae_accum_thread;
      local_70._M_string_length = uVar3 % uVar1 + sVar5;
      if (uVar2 != uVar1 - 1) {
        local_70._M_string_length = sVar5;
      }
      local_70.field_2._8_8_ =
           (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar7;
      local_48 = local_98;
      local_50 = pred;
      ThreadPool::
      enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>>
                ((ThreadPool *)&stack0xffffffffffffffc0,
                 (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
                  *)(this->super_Metric).pool_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      lVar7 = lVar7 + 4;
      uVar2 = uVar2 + 1;
    }
    ThreadPool::Sync((this->super_Metric).pool_,(int)uVar1);
    rVar8 = this->error_;
    for (lVar7 = 0;
        (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2 != lVar7; lVar7 = lVar7 + 1) {
      rVar8 = rVar8 + sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7];
      this->error_ = rVar8;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&sum.super__Vector_base<float,_std::allocator<float>_>);
    return;
  }
  local_a0.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             &local_99);
  std::__cxx11::string::string((string *)&sum,"Accumulate",&local_9a);
  poVar6 = Logger::Start(ERR,&local_70,0x2c4,(string *)&sum);
  poVar6 = std::operator<<(poVar6,"CHECK_EQ failed ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
                          );
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2c4);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"Y.size()");
  poVar6 = std::operator<<(poVar6," = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"pred.size()");
  poVar6 = std::operator<<(poVar6," = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&sum);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_a0);
  abort();
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    total_example_ += Y.size();
    // multi-thread training
    std::vector<real_t> sum(threadNumber_, 0);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(mae_accum_thread,
                               &Y,
                               &pred,
                               &(sum[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all of the threads finish their job
    pool_->Sync(threadNumber_);
    for (size_t i = 0; i < sum.size(); ++i) {
      error_ += sum[i];
    }
  }